

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

int __thiscall re2::DFA::BuildAllStates(DFA *this,DFAStateCallback *cb)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  uint8_t *puVar4;
  reference pvVar5;
  reference ppSVar6;
  reference piVar7;
  vector<int,_std::allocator<int>_> *in_RSI;
  DFA *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<re2::DFA::State_*const,_int>,_false,_false>,_bool>
  pVar8;
  SearchParams *in_stack_000000a0;
  DFA *in_stack_000000a8;
  State *ns;
  int c_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  State *s;
  bool oom;
  vector<int,_std::allocator<int>_> output;
  int b;
  int c;
  vector<int,_std::allocator<int>_> input;
  int nnext;
  deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> q;
  unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  m;
  SearchParams params;
  RWLocker l;
  unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  DFA *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  size_type in_stack_fffffffffffffd38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  mapped_type in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  DFA *in_stack_fffffffffffffd50;
  _Node_iterator_base<std::pair<re2::DFA::State_*const,_int>,_false> in_stack_fffffffffffffd70;
  _Node_iterator_base<std::pair<re2::DFA::State_*const,_int>,_false> local_1e8;
  _Node_iterator_base<std::pair<re2::DFA::State_*const,_int>,_false> local_1e0;
  State *local_1d8;
  int local_1cc;
  int *local_1c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  vector<int,_std::allocator<int>_> *local_1b8;
  value_type local_1b0;
  byte local_1a2;
  vector<int,_std::allocator<int>_> local_1a0;
  uint local_184;
  int local_180;
  vector<int,_std::allocator<int>_> local_178;
  int local_15c;
  _Node_iterator_base<std::pair<re2::DFA::State_*const,_int>,_false> local_158;
  undefined1 local_150;
  undefined4 local_144;
  undefined4 local_b4;
  StringPiece local_b0 [2];
  StringPiece local_90;
  SearchParams local_80;
  RWLocker local_28;
  vector<int,_std::allocator<int>_> *local_18;
  int local_4;
  
  local_18 = in_RSI;
  bVar1 = ok(in_RDI);
  if (bVar1) {
    RWLocker::RWLocker((RWLocker *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       (Mutex *)in_stack_fffffffffffffd18);
    StringPiece::StringPiece(&local_90);
    StringPiece::StringPiece(local_b0);
    SearchParams::SearchParams(&local_80,&local_90,local_b0,&local_28);
    local_80.anchored = false;
    bVar1 = AnalyzeSearch(in_stack_000000a8,in_stack_000000a0);
    if (((bVar1) && (local_80.start != (State *)0x0)) && (local_80.start != (State *)0x1)) {
      std::
      unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
      ::unordered_map((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                       *)0x249fec);
      std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::deque
                ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)0x249ff9);
      sVar3 = std::
              unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
              ::size((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                      *)0x24a020);
      local_144 = (undefined4)sVar3;
      pVar8 = std::
              unordered_map<re2::DFA::State*,int,std::hash<re2::DFA::State*>,std::equal_to<re2::DFA::State*>,std::allocator<std::pair<re2::DFA::State*const,int>>>
              ::emplace<re2::DFA::State*&,int>
                        ((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                         (State **)in_stack_fffffffffffffd28,
                         (int *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      local_158._M_cur =
           (__node_type *)
           pVar8.first.super__Node_iterator_base<std::pair<re2::DFA::State_*const,_int>,_false>.
           _M_cur;
      local_150 = pVar8.second;
      std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (value_type *)in_stack_fffffffffffffd18);
      local_15c = Prog::bytemap_range(in_RDI->prog_);
      local_15c = local_15c + 1;
      std::allocator<int>::allocator((allocator<int> *)0x24a0d8);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::allocator<int>::~allocator((allocator<int> *)0x24a104);
      for (local_180 = 0; local_180 < 0x100; local_180 = local_180 + 1) {
        puVar4 = Prog::bytemap(in_RDI->prog_);
        local_184 = (uint)puVar4[local_180];
        while( true ) {
          bVar1 = false;
          if (local_180 < 0xff) {
            puVar4 = Prog::bytemap(in_RDI->prog_);
            bVar1 = puVar4[local_180 + 1] == local_184;
          }
          iVar2 = local_180;
          if (!bVar1) break;
          local_180 = local_180 + 1;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)(int)local_184)
        ;
        *pvVar5 = iVar2;
      }
      iVar2 = Prog::bytemap_range(in_RDI->prog_);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)iVar2);
      *pvVar5 = 0x100;
      std::allocator<int>::allocator((allocator<int> *)0x24a2da);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::allocator<int>::~allocator((allocator<int> *)0x24a300);
      local_1a2 = 0;
      do {
        bVar1 = std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::empty
                          ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)0x24a315)
        ;
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppSVar6 = std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::front
                            ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
        local_1b0 = *ppSVar6;
        std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::pop_front
                  ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        local_1b8 = &local_178;
        local_1c0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd18);
        local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd18
                                     );
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffd18), bVar1) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_1c0);
          local_1cc = *piVar7;
          local_1d8 = RunStateOnByteUnlocked
                                (in_stack_fffffffffffffd50,
                                 (State *)CONCAT44(in_stack_fffffffffffffd4c,
                                                   in_stack_fffffffffffffd48),
                                 (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
          if (local_1d8 == (State *)0x0) {
            local_1a2 = 1;
            break;
          }
          if (local_1d8 == (State *)0x1) {
            iVar2 = ByteMap(in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_1a0,(long)iVar2);
            *pvVar5 = -1;
          }
          else {
            in_stack_fffffffffffffd70._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                 ::find(in_stack_fffffffffffffd18,(key_type *)0x24a4a4);
            local_1e0._M_cur = in_stack_fffffffffffffd70._M_cur;
            local_1e8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                 ::end(in_stack_fffffffffffffd18);
            bVar1 = std::__detail::operator==(&local_1e0,&local_1e8);
            if (bVar1) {
              std::
              unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
              ::size((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                      *)0x24a4fa);
              std::
              unordered_map<re2::DFA::State*,int,std::hash<re2::DFA::State*>,std::equal_to<re2::DFA::State*>,std::allocator<std::pair<re2::DFA::State*const,int>>>
              ::emplace<re2::DFA::State*&,int>
                        ((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                         (State **)in_stack_fffffffffffffd28,
                         (int *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
              std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                        ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                         CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                         (value_type *)in_stack_fffffffffffffd18);
            }
            in_stack_fffffffffffffd50 =
                 (DFA *)std::
                        unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                        ::operator[]((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),(key_type *)in_stack_fffffffffffffd18);
            in_stack_fffffffffffffd48 = *(mapped_type *)&in_stack_fffffffffffffd50->prog_;
            in_stack_fffffffffffffd4c = ByteMap(in_stack_fffffffffffffd28,in_stack_fffffffffffffd24)
            ;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_1a0,(long)in_stack_fffffffffffffd4c);
            *pvVar5 = in_stack_fffffffffffffd48;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_1c0);
        }
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(const_int_*,_bool)> *)
                           CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        if (bVar1) {
          in_stack_fffffffffffffd40 = local_18;
          if ((local_1a2 & 1) == 0) {
            in_stack_fffffffffffffd28 =
                 (DFA *)std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)0x24a607);
          }
          else {
            in_stack_fffffffffffffd28 = (DFA *)0x0;
          }
          in_stack_fffffffffffffd37 = true;
          if (local_1b0 != (State *)0x2) {
            in_stack_fffffffffffffd37 = State::IsMatch(local_1b0);
            in_stack_fffffffffffffd24 =
                 CONCAT13(in_stack_fffffffffffffd37,(int3)in_stack_fffffffffffffd24);
          }
          std::function<void_(const_int_*,_bool)>::operator()
                    ((function<void_(const_int_*,_bool)> *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (int *)in_stack_fffffffffffffd28,
                     SUB41((uint)in_stack_fffffffffffffd24 >> 0x18,0));
        }
      } while ((local_1a2 & 1) == 0);
      sVar3 = std::
              unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
              ::size((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                      *)0x24a683);
      local_4 = (int)sVar3;
      local_b4 = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::~deque
                ((deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)
                 in_stack_fffffffffffffd70._M_cur);
      std::
      unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
      ::~unordered_map((unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                        *)0x24a6c9);
    }
    else {
      local_4 = 0;
      local_b4 = 1;
    }
    RWLocker::~RWLocker((RWLocker *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DFA::BuildAllStates(const Prog::DFAStateCallback& cb) {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) ||
      params.start == NULL ||
      params.start == DeadState)
    return 0;

  // Add start state to work queue.
  // Note that any State* that we handle here must point into the cache,
  // so we can simply depend on pointer-as-a-number hashing and equality.
  std::unordered_map<State*, int> m;
  std::deque<State*> q;
  m.emplace(params.start, static_cast<int>(m.size()));
  q.push_back(params.start);

  // Compute the input bytes needed to cover all of the next pointers.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  std::vector<int> input(nnext);
  for (int c = 0; c < 256; c++) {
    int b = prog_->bytemap()[c];
    while (c < 256-1 && prog_->bytemap()[c+1] == b)
      c++;
    input[b] = c;
  }
  input[prog_->bytemap_range()] = kByteEndText;

  // Scratch space for the output.
  std::vector<int> output(nnext);

  // Flood to expand every state.
  bool oom = false;
  while (!q.empty()) {
    State* s = q.front();
    q.pop_front();
    for (int c : input) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        oom = true;
        break;
      }
      if (ns == DeadState) {
        output[ByteMap(c)] = -1;
        continue;
      }
      if (m.find(ns) == m.end()) {
        m.emplace(ns, static_cast<int>(m.size()));
        q.push_back(ns);
      }
      output[ByteMap(c)] = m[ns];
    }
    if (cb)
      cb(oom ? NULL : output.data(),
         s == FullMatchState || s->IsMatch());
    if (oom)
      break;
  }

  return static_cast<int>(m.size());
}